

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

bool pbrt::ParseArg<std::__cxx11::string*>
               (char ***argv,string *name,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *onError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char **ppcVar3;
  char *__s;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  string value;
  string arg;
  __string_type __str;
  string ret;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  anon_unknown_15 *local_b0;
  string *local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = out;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,**argv,(allocator<char> *)&local_f8);
  if (local_d8._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
  }
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_15::normalizeArg
            (&local_f8,(anon_unknown_15 *)local_d8._M_dataplus._M_p,
             (string *)local_d8._M_string_length);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_b0 = (anon_unknown_15 *)local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_b0,(ulong)local_a8,0,'\x01');
  anon_unknown_15::normalizeArg(&local_90,local_b0,local_a8);
  if (local_f8._M_string_length < local_90._M_string_length) {
    bVar7 = false;
  }
  else if (local_90._M_string_length == 0) {
    bVar7 = true;
  }
  else {
    lVar5 = 0;
    do {
      bVar7 = local_90._M_dataplus._M_p[lVar5] == local_f8._M_dataplus._M_p[lVar5];
      if (!bVar7) break;
      bVar6 = local_90._M_string_length - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar6);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != (anon_unknown_15 *)local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  paVar1 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    *argv = *argv + 1;
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)&local_d8);
    bVar7 = local_f8._M_string_length != 0;
    if (local_f8._M_string_length == 0) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_50,"invalid value \"%s\" for %s argument",&local_f8,name);
      if ((onError->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*onError->_M_invoker)((_Any_data *)onError,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    anon_unknown_15::normalizeArg
              (&local_f8,(anon_unknown_15 *)local_d8._M_dataplus._M_p,
               (string *)local_d8._M_string_length);
    anon_unknown_15::normalizeArg
              (&local_90,(anon_unknown_15 *)(name->_M_dataplus)._M_p,
               (string *)name->_M_string_length);
    if (local_f8._M_string_length == local_90._M_string_length) {
      if (local_f8._M_string_length == 0) {
        bVar7 = true;
      }
      else {
        iVar4 = bcmp(local_f8._M_dataplus._M_p,local_90._M_dataplus._M_p,local_f8._M_string_length);
        bVar7 = iVar4 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      ppcVar3 = *argv;
      *argv = ppcVar3 + 1;
      __s = ppcVar3[1];
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,__s,(allocator<char> *)&local_90);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)local_b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        *argv = *argv + 1;
        bVar7 = true;
        goto LAB_002aa053;
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_70,"missing value after %s argument",&local_d8);
      if ((onError->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*onError->_M_invoker)((_Any_data *)onError,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar7 = false;
  }
LAB_002aa053:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}